

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_fp32_to_bf16_row_ref(float *x,ggml_bf16_t *y,int64_t n)

{
  ggml_bf16_t gVar1;
  long lVar2;
  
  lVar2 = 0;
  if (n < 1) {
    n = lVar2;
  }
  for (; n != lVar2; lVar2 = lVar2 + 1) {
    gVar1 = ggml_compute_fp32_to_bf16(x[lVar2]);
    y[lVar2].bits = gVar1.bits;
  }
  return;
}

Assistant:

void ggml_fp32_to_bf16_row_ref(const float * x, ggml_bf16_t * y, int64_t n) {
    for (int i = 0; i < n; i++) {
        y[i] = ggml_compute_fp32_to_bf16(x[i]);
    }
}